

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O0

Pattern * __thiscall ContextPattern::doAnd(ContextPattern *this,Pattern *b,int4 sa)

{
  int iVar1;
  undefined4 extraout_var;
  PatternBlock *mv;
  long local_60;
  PatternBlock *resblock;
  ContextPattern *b2;
  int4 sa_local;
  Pattern *b_local;
  ContextPattern *this_local;
  
  if (b == (Pattern *)0x0) {
    local_60 = 0;
  }
  else {
    local_60 = __dynamic_cast(b,&Pattern::typeinfo,&typeinfo,0);
  }
  if (local_60 == 0) {
    iVar1 = (*b->_vptr_Pattern[5])(b,this,(ulong)(uint)-sa);
    this_local = (ContextPattern *)CONCAT44(extraout_var,iVar1);
  }
  else {
    mv = PatternBlock::intersect(this->maskvalue,*(PatternBlock **)(local_60 + 8));
    this_local = (ContextPattern *)operator_new(0x10);
    ContextPattern(this_local,mv);
  }
  return (Pattern *)this_local;
}

Assistant:

Pattern *ContextPattern::doAnd(const Pattern *b,int4 sa) const

{
  const ContextPattern *b2 = dynamic_cast<const ContextPattern *>(b);
  if (b2 == (const ContextPattern *)0)
    return b->doAnd(this,-sa);

  PatternBlock *resblock = maskvalue->intersect(b2->maskvalue);
  return new ContextPattern(resblock);
}